

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::Var::~Var(Var *this)

{
  pointer pcVar1;
  
  if ((this->type_ == Name) &&
     (pcVar1 = (this->field_2).name_._M_dataplus._M_p,
     pcVar1 != (pointer)((long)&this->field_2 + 0x10))) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

bool is_name() const { return type_ == VarType::Name; }